

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

RandomNormalLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomnormallike
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x492) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x492;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.randomnormallike_ =
         google::protobuf::Arena::
         CreateMaybeMessage<CoreML::Specification::RandomNormalLikeLayerParams>(arena);
    (this->layer_).randomnormallike_ = (RandomNormalLikeLayerParams *)LVar2;
  }
  return (RandomNormalLikeLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalLikeLayerParams* NeuralNetworkLayer::_internal_mutable_randomnormallike() {
  if (!_internal_has_randomnormallike()) {
    clear_layer();
    set_has_randomnormallike();
    layer_.randomnormallike_ = CreateMaybeMessage< ::CoreML::Specification::RandomNormalLikeLayerParams >(GetArenaForAllocation());
  }
  return layer_.randomnormallike_;
}